

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O3

pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_bool>
 __thiscall
llvm::
StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
::try_emplace<>(StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
                *this,StringRef Key)

{
  StringMapEntryBase **ppSVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  StringMapEntryBase *pSVar5;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
  *pSVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
  SVar8;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_bool>
  pVar9;
  
  uVar3 = StringMapImpl::LookupBucketFor(&this->super_StringMapImpl,Key);
  SVar8.Ptr = (this->super_StringMapImpl).TheTable + uVar3;
  pSVar5 = *SVar8.Ptr;
  if (pSVar5 == (StringMapEntryBase *)0xfffffffffffffff8) {
    puVar2 = &(this->super_StringMapImpl).NumTombstones;
    *puVar2 = *puVar2 - 1;
  }
  else if (pSVar5 != (StringMapEntryBase *)0x0) {
    while ((pSVar5 == (StringMapEntryBase *)0x0 ||
           (pSVar5 == (StringMapEntryBase *)0xfffffffffffffff8))) {
      ppSVar1 = SVar8.Ptr + 1;
      SVar8.Ptr = SVar8.Ptr + 1;
      pSVar5 = *ppSVar1;
    }
    uVar7 = 0;
    goto LAB_0017a4a3;
  }
  pSVar6 = StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
           ::Create<llvm::MallocAllocator>(Key,(MallocAllocator *)&this->field_0x18);
  *SVar8.Ptr = &pSVar6->super_StringMapEntryBase;
  uVar4 = (this->super_StringMapImpl).NumItems + 1;
  (this->super_StringMapImpl).NumItems = uVar4;
  if ((this->super_StringMapImpl).NumBuckets < uVar4 + (this->super_StringMapImpl).NumTombstones) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Node>>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = std::unique_ptr<llbuild::buildsystem::Node>, AllocatorTy = llvm::MallocAllocator, ArgsTy = <>]"
                 );
  }
  uVar3 = StringMapImpl::RehashTable(&this->super_StringMapImpl,uVar3);
  for (SVar8.Ptr = (this->super_StringMapImpl).TheTable + uVar3;
      (*SVar8.Ptr == (StringMapEntryBase *)0x0 ||
      (*SVar8.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar8.Ptr = SVar8.Ptr + 1) {
  }
  uVar7 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_0017a4a3:
  pVar9._8_8_ = uVar7;
  pVar9.first.
  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
          )(StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
            )SVar8.Ptr;
  return pVar9;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }